

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O0

uint __thiscall OpenMesh::PolyConnectivity::valence(PolyConnectivity *this,VertexHandle _vh)

{
  bool bVar1;
  undefined1 local_38 [8];
  ConstVertexVertexIter vv_it;
  uint count;
  PolyConnectivity *this_local;
  VertexHandle _vh_local;
  
  vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ = 0;
  cvv_iter((ConstVertexVertexIter *)local_38,this,_vh);
  while( true ) {
    bVar1 = Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
            ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                        *)local_38);
    if (!bVar1) break;
    vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ =
         vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ + 1;
    Iterators::
    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
    ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                  *)local_38);
  }
  return vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_;
}

Assistant:

uint PolyConnectivity::valence(VertexHandle _vh) const
{
  uint count(0);
  for (ConstVertexVertexIter vv_it=cvv_iter(_vh); vv_it.is_valid(); ++vv_it)
    ++count;
  return count;
}